

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9RexWalk(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nWalks;
  char *pcVar2;
  uint fVerbose;
  int iVar3;
  uint local_3c;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nWalks = 5;
  local_3c = 0x32;
  do {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"SRvh"), iVar3 = globalUtilOptind, iVar1 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 == -1) {
        if (pAbc->pGia != (Gia_Man_t *)0x0) {
          Gia_ManAutomWalk(pAbc->pGia,local_3c,nWalks,fVerbose);
          return 0;
        }
        pcVar2 = "Abc_CommandAbc9Show(): There is no AIG.\n";
        iVar3 = -1;
        goto LAB_00213982;
      }
      if (iVar1 == 0x52) break;
      if (iVar1 != 0x53) goto LAB_00213905;
      if (argc <= globalUtilOptind) {
        pcVar2 = "Command line switch \"-S\" should be followed by an integer.\n";
LAB_002138f7:
        Abc_Print(-1,pcVar2);
        goto LAB_00213905;
      }
      local_3c = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      if ((int)local_3c < 0) goto LAB_00213905;
    }
    if (argc <= globalUtilOptind) {
      pcVar2 = "Command line switch \"-R\" should be followed by an integer.\n";
      goto LAB_002138f7;
    }
    nWalks = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
  } while (-1 < (int)nWalks);
LAB_00213905:
  iVar3 = -2;
  Abc_Print(-2,"usage: &rexwalk [-SR] [-vh]\n");
  Abc_Print(-2,"\t         performs simulation of an AIG representing a regular expression\n");
  Abc_Print(-2,"\t-S num : the number of steps to take [default = %d]\n",(ulong)local_3c);
  Abc_Print(-2,"\t-R num : the number of walks to make [default = %d]\n",(ulong)nWalks);
  pcVar2 = "yes";
  if (fVerbose == 0) {
    pcVar2 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar2);
  pcVar2 = "\t-h     : print the command usage\n";
LAB_00213982:
  Abc_Print(iVar3,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandAbc9RexWalk( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManAutomWalk( Gia_Man_t * p, int nSteps, int nWalks, int fVerbose );
    int c, nSteps = 50, nWalks = 5, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SRvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nSteps = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nSteps < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nWalks = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWalks < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManAutomWalk( pAbc->pGia, nSteps, nWalks, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &rexwalk [-SR] [-vh]\n" );
    Abc_Print( -2, "\t         performs simulation of an AIG representing a regular expression\n" );
    Abc_Print( -2, "\t-S num : the number of steps to take [default = %d]\n", nSteps );
    Abc_Print( -2, "\t-R num : the number of walks to make [default = %d]\n", nWalks );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}